

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  PrimRefMB *pPVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  size_t itime;
  int iVar26;
  long lVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar44 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar69;
  float fVar70;
  float fVar71;
  vfloat4 a0;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined4 uVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar107;
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar110;
  undefined1 auVar111 [64];
  undefined1 auVar112 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [64];
  undefined1 auVar116 [16];
  Vec3fa n0;
  undefined1 auVar117 [16];
  float fVar119;
  Vec3ff v3;
  undefined1 auVar118 [16];
  float fVar120;
  undefined1 in_ZMM17 [64];
  undefined1 auVar121 [64];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_2a8;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  unsigned_long local_270;
  size_t local_268;
  size_t local_260;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_258;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_248;
  undefined1 local_238 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  undefined1 local_218 [16];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  ulong local_1d0;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined8 uStack_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 uStack_198;
  undefined8 uStack_190;
  anon_class_16_2_07cfa4d6 local_188;
  float local_178;
  undefined4 uStack_174;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_158;
  undefined1 local_148 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_138;
  undefined1 local_128 [16];
  float local_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  undefined1 local_c8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  auVar61._16_16_ = in_YmmResult._16_16_;
  auVar61._0_16_ = (range<unsigned_long>)vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar121 = ZEXT1664((undefined1  [16])auVar61._0_16_);
  __return_storage_ptr__->object_range = auVar61._0_16_;
  uVar20 = r->_begin;
  if (uVar20 < r->_end) {
    auVar99 = ZEXT464(0x3f800000);
    auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
    local_248.m128[2] = -INFINITY;
    local_248._0_8_ = 0xff800000ff800000;
    local_248.m128[3] = -INFINITY;
    auVar108 = ZEXT1664((undefined1  [16])local_248);
    local_258.m128[2] = INFINITY;
    local_258._0_8_ = 0x7f8000007f800000;
    local_258.m128[3] = INFINITY;
    auVar111 = ZEXT1664((undefined1  [16])local_258);
    local_270 = 0;
    auVar115 = ZEXT1664((undefined1  [16])local_258);
    local_268 = 0;
    local_2a8 = 0;
    local_218 = ZEXT816(0);
    local_238 = SUB6416(ZEXT464(0x3f800000),0);
    local_260 = k;
    local_228 = local_248;
    do {
      auVar112 = auVar115._0_16_;
      auVar109 = auVar111._0_16_;
      auVar104 = auVar108._0_16_;
      auVar97 = auVar99._0_16_;
      auVar29 = auVar103._0_16_;
      BVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar37._8_8_ = 0;
      auVar37._0_4_ = BVar1.lower;
      auVar37._4_4_ = BVar1.upper;
      auVar43 = vmovshdup_avx(auVar37);
      fVar71 = BVar1.lower;
      fVar80 = auVar43._0_4_ - fVar71;
      uVar18 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar20);
      uVar21 = (ulong)(uVar18 + 3);
      pBVar2 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar21 < (pBVar2->super_RawBufferView).num) {
        fVar69 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.fnumTimeSegments;
        auVar43 = ZEXT416((uint)(fVar69 * ((t0t1->lower - fVar71) / fVar80) * 1.0000002));
        auVar43 = vroundss_avx(auVar43,auVar43,9);
        auVar43 = vmaxss_avx(auVar29,auVar43);
        auVar42 = ZEXT416((uint)(fVar69 * ((t0t1->upper - fVar71) / fVar80) * 0.99999976));
        auVar42 = vroundss_avx(auVar42,auVar42,10);
        auVar42 = vminss_avx(auVar42,ZEXT416((uint)fVar69));
        if ((uint)(int)auVar43._0_4_ <= (uint)(int)auVar42._0_4_) {
          uVar19 = (ulong)(int)auVar43._0_4_;
          pBVar3 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   normals.items;
          fVar80 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          fStack_200 = (float)bezier_basis0._484_8_;
          fStack_1fc = SUB84(bezier_basis0._484_8_,4);
          uStack_198 = bezier_basis0._1648_8_;
          uStack_190 = bezier_basis0._1656_8_;
          fStack_1a4 = SUB84(bezier_basis0._1632_8_,4);
          fStack_1a0 = (float)bezier_basis0._1640_8_;
          fStack_19c = SUB84(bezier_basis0._1640_8_,4);
          uStack_1c0 = bezier_basis0._2796_8_;
          uStack_1b8 = bezier_basis0._2804_8_;
          uStack_1b0 = bezier_basis0._2812_8_;
          uStack_1c4 = SUB84(bezier_basis0._2788_8_,4);
          local_f8 = bezier_basis0._3944_8_;
          uStack_f0 = bezier_basis0._3952_8_;
          uStack_e8 = bezier_basis0._3960_8_;
          uStack_e0 = bezier_basis0._3968_8_;
          uStack_170 = bezier_basis0._5108_8_;
          uStack_168 = bezier_basis0._5116_8_;
          uStack_160 = bezier_basis0._5124_8_;
          uStack_174 = SUB84(bezier_basis0._5100_8_,4);
          uStack_110 = bezier_basis0._6264_8_;
          uStack_108 = bezier_basis0._6272_8_;
          uStack_100 = bezier_basis0._6280_8_;
          local_118 = (float)bezier_basis0._6256_8_;
          uStack_114 = SUB84(bezier_basis0._6256_8_,4);
          local_58 = bezier_basis0._7412_8_;
          uStack_50 = bezier_basis0._7420_8_;
          uStack_48 = bezier_basis0._7428_8_;
          uStack_40 = bezier_basis0._7436_8_;
          local_78 = bezier_basis0._8568_8_;
          uStack_70 = bezier_basis0._8576_8_;
          uStack_68 = bezier_basis0._8584_8_;
          uStack_60 = bezier_basis0._8592_8_;
          lVar22 = uVar19 * 0x38 + 0x10;
          auVar43._8_4_ = 0xddccb9a2;
          auVar43._0_8_ = 0xddccb9a2ddccb9a2;
          auVar43._12_4_ = 0xddccb9a2;
          auVar44._16_16_ = auVar61._16_16_;
          auVar44._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
          auVar61 = auVar44;
          do {
            lVar4 = *(long *)((long)pBVar2 + lVar22 + -0x10);
            lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar22);
            lVar27 = lVar5 * (ulong)uVar18;
            auVar29._8_4_ = 0x7fffffff;
            auVar29._0_8_ = 0x7fffffff7fffffff;
            auVar29._12_4_ = 0x7fffffff;
            auVar37 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar27)),auVar29);
            if (1.844e+18 <= auVar37._0_4_) {
LAB_01ee5121:
              auVar99 = ZEXT1664(auVar97);
              auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar108 = ZEXT1664(auVar104);
              auVar111 = ZEXT1664(auVar109);
              auVar115 = ZEXT1664(auVar112);
              goto LAB_01ee550b;
            }
            lVar24 = lVar5 * (ulong)(uVar18 + 1);
            auVar37 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar24)),auVar29);
            if (1.844e+18 <= auVar37._0_4_) goto LAB_01ee5121;
            lVar25 = lVar5 * (ulong)(uVar18 + 2);
            auVar37 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar25)),auVar29);
            if (1.844e+18 <= auVar37._0_4_) goto LAB_01ee5121;
            auVar37 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar21)),auVar29);
            if (1.844e+18 <= auVar37._0_4_) goto LAB_01ee5121;
            auVar37 = *(undefined1 (*) [16])(lVar4 + lVar27);
            uVar14 = vcmpps_avx512vl(auVar37,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar37,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            auVar29 = *(undefined1 (*) [16])(lVar4 + lVar24);
            uVar14 = vcmpps_avx512vl(auVar29,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar29,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            auVar35 = *(undefined1 (*) [16])(lVar4 + lVar25);
            uVar14 = vcmpps_avx512vl(auVar35,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar35,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            auVar31 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar21);
            uVar14 = vcmpps_avx512vl(auVar31,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar31,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            lVar4 = *(long *)((long)pBVar3 + lVar22 + -0x10);
            lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar22);
            auVar38 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)uVar18);
            uVar14 = vcmpps_avx512vl(auVar38,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar38,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            auVar39 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar18 + 1));
            auVar61._0_16_ = (range<unsigned_long>)auVar39;
            uVar14 = vcmpps_avx512vl(auVar39,auVar43,6);
            uVar15 = vcmpps_avx512vl(auVar39,auVar44._0_16_,1);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) goto LAB_01ee5121;
            auVar43 = vshufps_avx(auVar37,auVar37,0xff);
            auVar36 = vinsertps_avx(auVar37,ZEXT416((uint)(auVar43._0_4_ * fVar80)),0x30);
            auVar43 = vshufps_avx(auVar29,auVar29,0xff);
            auVar29 = vinsertps_avx(auVar29,ZEXT416((uint)(auVar43._0_4_ * fVar80)),0x30);
            auVar43 = vshufps_avx(auVar35,auVar35,0xff);
            auVar40 = vinsertps_avx512f(auVar35,ZEXT416((uint)(auVar43._0_4_ * fVar80)),0x30);
            auVar43 = vshufps_avx(auVar31,auVar31,0xff);
            auVar35 = vinsertps_avx(auVar31,ZEXT416((uint)(auVar43._0_4_ * fVar80)),0x30);
            auVar43 = *(undefined1 (*) [16])(lVar4 + lVar5 * (ulong)(uVar18 + 2));
            auVar37 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar21);
            auVar77 = auVar121._0_16_;
            auVar30 = vmulps_avx512vl(auVar35,auVar77);
            auVar85._8_4_ = 0x3e2aaaab;
            auVar85._0_8_ = 0x3e2aaaab3e2aaaab;
            auVar85._12_4_ = 0x3e2aaaab;
            auVar31 = vfmadd213ps_avx512vl(auVar85,auVar40,auVar30);
            auVar87._8_4_ = 0x3f2aaaab;
            auVar87._0_8_ = 0x3f2aaaab3f2aaaab;
            auVar87._12_4_ = 0x3f2aaaab;
            auVar31 = vfmadd231ps_fma(auVar31,auVar29,auVar87);
            auVar41 = vfmadd231ps_fma(auVar31,auVar36,auVar85);
            auVar82._8_4_ = 0x3f000000;
            auVar82._0_8_ = 0x3f0000003f000000;
            auVar82._12_4_ = 0x3f000000;
            auVar31 = vfmadd231ps_avx512vl(auVar30,auVar40,auVar82);
            auVar31 = vfnmadd231ps_avx512vl(auVar31,auVar29,auVar77);
            auVar30 = vfnmadd231ps_fma(auVar31,auVar36,auVar82);
            auVar31 = vmulps_avx512vl(auVar37,auVar77);
            auVar32 = vfmadd213ps_avx512vl(auVar85,auVar43,auVar31);
            auVar32 = vfmadd231ps_avx512vl(auVar32,auVar39,auVar87);
            auVar32 = vfmadd231ps_avx512vl(auVar32,auVar38,auVar85);
            auVar31 = vfmadd231ps_avx512vl(auVar31,auVar43,auVar82);
            auVar31 = vfnmadd231ps_avx512vl(auVar31,auVar39,auVar77);
            auVar33 = vfnmadd231ps_avx512vl(auVar31,auVar38,auVar82);
            auVar34._0_4_ = auVar35._0_4_ * 0.16666667;
            auVar34._4_4_ = auVar35._4_4_ * 0.16666667;
            auVar34._8_4_ = auVar35._8_4_ * 0.16666667;
            auVar34._12_4_ = auVar35._12_4_ * 0.16666667;
            auVar31 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar87);
            auVar31 = vfmadd231ps_fma(auVar31,auVar29,auVar85);
            auVar34 = vfmadd231ps_avx512vl(auVar31,auVar36,auVar77);
            auVar118._0_4_ = auVar35._0_4_ * 0.5;
            auVar118._4_4_ = auVar35._4_4_ * 0.5;
            auVar118._8_4_ = auVar35._8_4_ * 0.5;
            auVar118._12_4_ = auVar35._12_4_ * 0.5;
            auVar35 = vfmadd231ps_avx512vl(auVar118,auVar77,auVar40);
            auVar29 = vfnmadd231ps_fma(auVar35,auVar82,auVar29);
            auVar36 = vfnmadd231ps_avx512vl(auVar29,auVar77,auVar36);
            auVar29 = vmulps_avx512vl(auVar37,auVar85);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar43,auVar87);
            auVar29 = vfmadd231ps_avx512vl(auVar29,auVar39,auVar85);
            auVar35 = vfmadd231ps_avx512vl(auVar29,auVar38,auVar77);
            auVar37 = vmulps_avx512vl(auVar37,auVar82);
            auVar43 = vfmadd231ps_avx512vl(auVar37,auVar77,auVar43);
            auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar82,auVar39);
            auVar37 = vfnmadd231ps_avx512vl(auVar43,auVar77,auVar38);
            auVar43 = vshufps_avx(auVar30,auVar30,0xc9);
            auVar29 = vshufps_avx512vl(auVar32,auVar32,0xc9);
            auVar38._0_4_ = auVar30._0_4_ * auVar29._0_4_;
            auVar38._4_4_ = auVar30._4_4_ * auVar29._4_4_;
            auVar38._8_4_ = auVar30._8_4_ * auVar29._8_4_;
            auVar38._12_4_ = auVar30._12_4_ * auVar29._12_4_;
            auVar29 = vfmsub231ps_avx512vl(auVar38,auVar43,auVar32);
            auVar29 = vshufps_avx(auVar29,auVar29,0xc9);
            auVar31 = vshufps_avx512vl(auVar33,auVar33,0xc9);
            auVar31 = vmulps_avx512vl(auVar30,auVar31);
            auVar43 = vfmsub231ps_avx512vl(auVar31,auVar43,auVar33);
            auVar38 = vshufps_avx512vl(auVar43,auVar43,0xc9);
            auVar31 = vshufps_avx512vl(auVar36,auVar36,0xc9);
            auVar43 = vshufps_avx(auVar35,auVar35,0xc9);
            fVar81 = auVar36._0_4_;
            auVar40._0_4_ = fVar81 * auVar43._0_4_;
            fVar70 = auVar36._4_4_;
            auVar40._4_4_ = fVar70 * auVar43._4_4_;
            fVar119 = auVar36._8_4_;
            auVar40._8_4_ = fVar119 * auVar43._8_4_;
            fVar120 = auVar36._12_4_;
            auVar40._12_4_ = fVar120 * auVar43._12_4_;
            auVar43 = vfmsub231ps_avx512vl(auVar40,auVar31,auVar35);
            auVar35 = vshufps_avx(auVar43,auVar43,0xc9);
            auVar43 = vshufps_avx512vl(auVar37,auVar37,0xc9);
            auVar39._0_4_ = fVar81 * auVar43._0_4_;
            auVar39._4_4_ = fVar70 * auVar43._4_4_;
            auVar39._8_4_ = fVar119 * auVar43._8_4_;
            auVar39._12_4_ = fVar120 * auVar43._12_4_;
            auVar43 = vfmsub231ps_avx512vl(auVar39,auVar31,auVar37);
            auVar31 = vshufps_avx(auVar43,auVar43,0xc9);
            auVar43 = vdpps_avx(auVar29,auVar29,0x7f);
            auVar47._16_16_ = auVar61._16_16_;
            auVar47._0_16_ = auVar77;
            auVar45._4_28_ = auVar47._4_28_;
            auVar45._0_4_ = auVar43._0_4_;
            auVar37 = vrsqrt14ss_avx512f(auVar77,auVar45._0_16_);
            auVar39 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3fc00000),0));
            auVar40 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
            auVar40 = vmulss_avx512f(auVar40,auVar37);
            auVar37 = vmulss_avx512f(auVar37,auVar37);
            auVar37 = vmulss_avx512f(auVar40,auVar37);
            auVar39 = vaddss_avx512f(auVar39,auVar37);
            auVar37 = vdpps_avx(auVar29,auVar38,0x7f);
            auVar39 = vbroadcastss_avx512vl(auVar39);
            auVar40 = vmulps_avx512vl(auVar29,auVar39);
            auVar32 = vbroadcastss_avx512vl(auVar43);
            auVar38 = vmulps_avx512vl(auVar32,auVar38);
            fVar71 = auVar37._0_4_;
            auVar32._0_4_ = fVar71 * auVar29._0_4_;
            auVar32._4_4_ = fVar71 * auVar29._4_4_;
            auVar32._8_4_ = fVar71 * auVar29._8_4_;
            auVar32._12_4_ = fVar71 * auVar29._12_4_;
            auVar37 = vsubps_avx(auVar38,auVar32);
            auVar29 = vrcp14ss_avx512f(auVar77,auVar45._0_16_);
            auVar43 = vfnmadd213ss_avx512f(auVar43,auVar29,ZEXT416(0x40000000));
            fVar71 = auVar29._0_4_ * auVar43._0_4_;
            auVar33._0_4_ = fVar71 * auVar37._0_4_;
            auVar33._4_4_ = fVar71 * auVar37._4_4_;
            auVar33._8_4_ = fVar71 * auVar37._8_4_;
            auVar33._12_4_ = fVar71 * auVar37._12_4_;
            auVar38 = vmulps_avx512vl(auVar39,auVar33);
            auVar43 = vdpps_avx(auVar35,auVar35,0x7f);
            auVar54._16_16_ = auVar61._16_16_;
            auVar54._0_16_ = auVar77;
            auVar49._4_28_ = auVar54._4_28_;
            auVar49._0_4_ = auVar43._0_4_;
            auVar37 = vrsqrt14ss_avx512f(auVar77,auVar49._0_16_);
            auVar29 = vmulss_avx512f(auVar37,SUB6416(ZEXT464(0x3fc00000),0));
            auVar39 = vmulss_avx512f(auVar43,ZEXT416(0xbf000000));
            auVar39 = vmulss_avx512f(auVar39,auVar37);
            auVar37 = vmulss_avx512f(auVar39,ZEXT416((uint)(auVar37._0_4_ * auVar37._0_4_)));
            auVar37 = vaddss_avx512f(auVar29,auVar37);
            auVar88._0_4_ = auVar37._0_4_;
            auVar88._4_4_ = auVar88._0_4_;
            auVar88._8_4_ = auVar88._0_4_;
            auVar88._12_4_ = auVar88._0_4_;
            auVar37 = vdpps_avx(auVar35,auVar31,0x7f);
            auVar39 = vmulps_avx512vl(auVar35,auVar88);
            auVar29 = vbroadcastss_avx512vl(auVar43);
            auVar29 = vmulps_avx512vl(auVar29,auVar31);
            fVar71 = auVar37._0_4_;
            auVar92._0_4_ = auVar35._0_4_ * fVar71;
            auVar92._4_4_ = auVar35._4_4_ * fVar71;
            auVar92._8_4_ = auVar35._8_4_ * fVar71;
            auVar92._12_4_ = auVar35._12_4_ * fVar71;
            auVar29 = vsubps_avx(auVar29,auVar92);
            auVar37 = vrcp14ss_avx512f(auVar77,auVar49._0_16_);
            auVar43 = vfnmadd213ss_avx512f(auVar43,auVar37,ZEXT416(0x40000000));
            fVar71 = auVar37._0_4_ * auVar43._0_4_;
            auVar43 = vshufps_avx(auVar41,auVar41,0xff);
            auVar32 = vmulps_avx512vl(auVar43,auVar40);
            auVar35 = vsubps_avx(auVar41,auVar32);
            auVar37 = vshufps_avx(auVar30,auVar30,0xff);
            auVar37 = vmulps_avx512vl(auVar37,auVar40);
            auVar77._0_4_ = auVar37._0_4_ + auVar43._0_4_ * auVar38._0_4_;
            auVar77._4_4_ = auVar37._4_4_ + auVar43._4_4_ * auVar38._4_4_;
            auVar77._8_4_ = auVar37._8_4_ + auVar43._8_4_ * auVar38._8_4_;
            auVar77._12_4_ = auVar37._12_4_ + auVar43._12_4_ * auVar38._12_4_;
            auVar31 = vsubps_avx(auVar30,auVar77);
            auVar40 = vaddps_avx512vl(auVar41,auVar32);
            auVar117._0_4_ = auVar30._0_4_ + auVar77._0_4_;
            auVar117._4_4_ = auVar30._4_4_ + auVar77._4_4_;
            auVar117._8_4_ = auVar30._8_4_ + auVar77._8_4_;
            auVar117._12_4_ = auVar30._12_4_ + auVar77._12_4_;
            auVar43 = vshufps_avx(auVar34,auVar34,0xff);
            auVar41 = vmulps_avx512vl(auVar43,auVar39);
            auVar38 = vsubps_avx(auVar34,auVar41);
            auVar37 = vshufps_avx(auVar36,auVar36,0xff);
            auVar37 = vmulps_avx512vl(auVar37,auVar39);
            auVar30._0_4_ = auVar37._0_4_ + auVar43._0_4_ * auVar88._0_4_ * auVar29._0_4_ * fVar71;
            auVar30._4_4_ = auVar37._4_4_ + auVar43._4_4_ * auVar88._0_4_ * auVar29._4_4_ * fVar71;
            auVar30._8_4_ = auVar37._8_4_ + auVar43._8_4_ * auVar88._0_4_ * auVar29._8_4_ * fVar71;
            auVar30._12_4_ =
                 auVar37._12_4_ + auVar43._12_4_ * auVar88._0_4_ * auVar29._12_4_ * fVar71;
            auVar43 = vsubps_avx(auVar36,auVar30);
            auVar116._0_4_ = auVar34._0_4_ + auVar41._0_4_;
            auVar116._4_4_ = auVar34._4_4_ + auVar41._4_4_;
            auVar116._8_4_ = auVar34._8_4_ + auVar41._8_4_;
            auVar116._12_4_ = auVar34._12_4_ + auVar41._12_4_;
            auVar41._0_4_ = fVar81 + auVar30._0_4_;
            auVar41._4_4_ = fVar70 + auVar30._4_4_;
            auVar41._8_4_ = fVar119 + auVar30._8_4_;
            auVar41._12_4_ = fVar120 + auVar30._12_4_;
            auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
            auVar29 = vmulps_avx512vl(auVar31,auVar37);
            fVar71 = auVar35._0_4_;
            auVar36._0_4_ = fVar71 + auVar29._0_4_;
            auVar36._4_4_ = auVar35._4_4_ + auVar29._4_4_;
            auVar36._8_4_ = auVar35._8_4_ + auVar29._8_4_;
            auVar36._12_4_ = auVar35._12_4_ + auVar29._12_4_;
            auVar43 = vmulps_avx512vl(auVar43,auVar37);
            auVar43 = vsubps_avx(auVar38,auVar43);
            auVar62._4_4_ = fVar71;
            auVar62._0_4_ = fVar71;
            auVar62._8_4_ = fVar71;
            auVar62._12_4_ = fVar71;
            auVar62._16_4_ = fVar71;
            auVar62._20_4_ = fVar71;
            auVar62._24_4_ = fVar71;
            auVar62._28_4_ = fVar71;
            auVar114._8_4_ = 1;
            auVar114._0_8_ = 0x100000001;
            auVar114._12_4_ = 1;
            auVar114._16_4_ = 1;
            auVar114._20_4_ = 1;
            auVar114._24_4_ = 1;
            auVar114._28_4_ = 1;
            auVar61 = vpermps_avx2(auVar114,ZEXT1632(auVar35));
            auVar45 = vbroadcastss_avx512vl(ZEXT416(2));
            auVar46 = vpermps_avx512vl(auVar45,ZEXT1632(auVar35));
            auVar47 = vbroadcastss_avx512vl(auVar36);
            auVar48 = vpermps_avx512vl(auVar114,ZEXT1632(auVar36));
            auVar49 = vpermps_avx512vl(auVar45,ZEXT1632(auVar36));
            auVar50 = vbroadcastss_avx512vl(auVar43);
            auVar51 = vpermps_avx512vl(auVar114,ZEXT1632(auVar43));
            auVar52 = vpermps_avx512vl(auVar45,ZEXT1632(auVar43));
            auVar53 = vbroadcastss_avx512vl(auVar38);
            auVar54 = vpermps_avx512vl(auVar114,ZEXT1632(auVar38));
            auVar55 = vpermps_avx512vl(auVar45,ZEXT1632(auVar38));
            auVar31._8_8_ = bezier_basis0._3952_8_;
            auVar31._0_8_ = bezier_basis0._3944_8_;
            auVar66._16_8_ = bezier_basis0._3960_8_;
            auVar66._0_16_ = auVar31;
            auVar66._24_8_ = bezier_basis0._3968_8_;
            auVar56 = vmulps_avx512vl(auVar53,auVar66);
            auVar67._8_8_ = bezier_basis0._2796_8_;
            auVar67._0_8_ = bezier_basis0._2788_8_;
            auVar67._16_8_ = bezier_basis0._2804_8_;
            auVar67._24_8_ = bezier_basis0._2812_8_;
            auVar57 = vfmadd231ps_avx512vl(auVar56,auVar67,auVar50);
            auVar56._8_8_ = bezier_basis0._8576_8_;
            auVar56._0_8_ = bezier_basis0._8568_8_;
            auVar56._16_8_ = bezier_basis0._8584_8_;
            auVar56._24_8_ = bezier_basis0._8592_8_;
            auVar53 = vmulps_avx512vl(auVar53,auVar56);
            auVar68._8_8_ = bezier_basis0._7420_8_;
            auVar68._0_8_ = bezier_basis0._7412_8_;
            auVar68._16_8_ = bezier_basis0._7428_8_;
            auVar68._24_8_ = bezier_basis0._7436_8_;
            auVar58 = vfmadd231ps_avx512vl(auVar53,auVar68,auVar50);
            auVar50 = vmulps_avx512vl(auVar54,auVar66);
            auVar50 = vfmadd231ps_avx512vl(auVar50,auVar67,auVar51);
            auVar53 = vmulps_avx512vl(auVar54,auVar56);
            auVar54 = vfmadd231ps_avx512vl(auVar53,auVar68,auVar51);
            auVar51 = vmulps_avx512vl(auVar55,auVar66);
            auVar51 = vfmadd231ps_avx512vl(auVar51,auVar67,auVar52);
            auVar53._8_4_ = fStack_1a0;
            auVar53._0_8_ = bezier_basis0._1632_8_;
            auVar53._12_4_ = fStack_19c;
            auVar53._16_8_ = bezier_basis0._1648_8_;
            auVar53._24_8_ = bezier_basis0._1656_8_;
            auVar57 = vfmadd231ps_avx512vl(auVar57,auVar53,auVar47);
            auVar50 = vfmadd231ps_avx512vl(auVar50,auVar53,auVar48);
            auVar59 = vfmadd231ps_avx512vl(auVar51,auVar53,auVar49);
            auVar51._8_4_ = fStack_200;
            auVar51._0_8_ = bezier_basis0._476_8_;
            auVar51._12_4_ = fStack_1fc;
            auVar51._16_8_ = bezier_basis0._492_8_;
            auVar51._24_8_ = bezier_basis0._500_8_;
            auVar57 = vfmadd231ps_avx512vl(auVar57,auVar51,auVar62);
            auVar60 = vfmadd231ps_avx512vl(auVar50,auVar51,auVar61);
            auVar59 = vfmadd231ps_avx512vl(auVar59,auVar51,auVar46);
            auVar50._4_4_ = auVar55._4_4_ * SUB84(bezier_basis0._8568_8_,4);
            auVar50._0_4_ = auVar55._0_4_ * (float)bezier_basis0._8568_8_;
            auVar50._8_4_ = auVar55._8_4_ * (float)bezier_basis0._8576_8_;
            auVar50._12_4_ = auVar55._12_4_ * SUB84(bezier_basis0._8576_8_,4);
            auVar50._16_4_ = auVar55._16_4_ * (float)bezier_basis0._8584_8_;
            auVar50._20_4_ = auVar55._20_4_ * SUB84(bezier_basis0._8584_8_,4);
            auVar50._24_4_ = auVar55._24_4_ * (float)bezier_basis0._8592_8_;
            auVar50._28_4_ = auVar55._28_4_;
            auVar50 = vfmadd231ps_avx512vl(auVar50,auVar68,auVar52);
            auVar52._8_8_ = bezier_basis0._6264_8_;
            auVar52._0_8_ = bezier_basis0._6256_8_;
            auVar52._16_8_ = bezier_basis0._6272_8_;
            auVar52._24_8_ = bezier_basis0._6280_8_;
            auVar47 = vfmadd231ps_avx512vl(auVar58,auVar52,auVar47);
            auVar54 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar48);
            auVar43 = vfmadd231ps_fma(auVar50,auVar52,auVar49);
            auVar48._8_8_ = bezier_basis0._5108_8_;
            auVar48._0_8_ = bezier_basis0._5100_8_;
            auVar48._16_8_ = bezier_basis0._5116_8_;
            auVar48._24_8_ = bezier_basis0._5124_8_;
            auVar50 = vfmadd231ps_avx512vl(auVar47,auVar48,auVar62);
            auVar61 = vfmadd231ps_avx512vl(auVar54,auVar48,auVar61);
            auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar48,auVar46);
            auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
            auVar54 = vmulps_avx512vl(auVar50,auVar49);
            auVar55 = vmulps_avx512vl(auVar61,auVar49);
            auVar58 = vmulps_avx512vl(ZEXT1632(auVar43),auVar49);
            auVar39 = ZEXT816(0) << 0x40;
            auVar61 = vblendps_avx(auVar54,ZEXT1632(auVar39),1);
            auVar50 = vblendps_avx(auVar55,ZEXT1632(auVar39),1);
            auVar64 = ZEXT1632(auVar39);
            auVar46 = vblendps_avx(auVar58,auVar64,1);
            auVar47 = vsubps_avx(auVar57,auVar61);
            auVar62 = vsubps_avx512vl(auVar60,auVar50);
            auVar63 = vsubps_avx512vl(auVar59,auVar46);
            auVar61 = vblendps_avx(auVar54,auVar64,0x80);
            auVar50 = vblendps_avx(auVar55,auVar64,0x80);
            auVar46 = vblendps_avx(auVar58,auVar64,0x80);
            auVar65._0_4_ = auVar57._0_4_ + auVar61._0_4_;
            auVar65._4_4_ = auVar57._4_4_ + auVar61._4_4_;
            auVar65._8_4_ = auVar57._8_4_ + auVar61._8_4_;
            auVar65._12_4_ = auVar57._12_4_ + auVar61._12_4_;
            auVar65._16_4_ = auVar57._16_4_ + auVar61._16_4_;
            auVar65._20_4_ = auVar57._20_4_ + auVar61._20_4_;
            auVar65._24_4_ = auVar57._24_4_ + auVar61._24_4_;
            auVar65._28_4_ = auVar57._28_4_ + auVar61._28_4_;
            auVar50 = vaddps_avx512vl(auVar60,auVar50);
            auVar46 = vaddps_avx512vl(auVar59,auVar46);
            auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar61 = vminps_avx512vl(auVar54,auVar57);
            auVar55 = vminps_avx512vl(auVar54,auVar60);
            auVar58 = vminps_avx512vl(auVar54,auVar59);
            auVar64 = vminps_avx512vl(auVar47,auVar65);
            auVar64 = vminps_avx512vl(auVar61,auVar64);
            auVar61 = vminps_avx512vl(auVar62,auVar50);
            auVar55 = vminps_avx512vl(auVar55,auVar61);
            auVar61 = vminps_avx512vl(auVar63,auVar46);
            auVar58 = vminps_avx512vl(auVar58,auVar61);
            auVar61 = vmaxps_avx(auVar47,auVar65);
            auVar43 = vmulps_avx512vl(auVar117,auVar37);
            auVar35 = vaddps_avx512vl(auVar40,auVar43);
            auVar43 = vmulps_avx512vl(auVar41,auVar37);
            auVar38 = vsubps_avx512vl(auVar116,auVar43);
            auVar65 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            auVar47 = vmaxps_avx512vl(auVar65,auVar57);
            auVar57 = vmaxps_avx512vl(auVar65,auVar60);
            auVar59 = vmaxps_avx512vl(auVar65,auVar59);
            auVar61 = vmaxps_avx(auVar47,auVar61);
            auVar50 = vmaxps_avx(auVar62,auVar50);
            auVar50 = vmaxps_avx(auVar57,auVar50);
            auVar46 = vmaxps_avx(auVar63,auVar46);
            auVar46 = vmaxps_avx(auVar59,auVar46);
            auVar47 = vshufps_avx512vl(auVar64,auVar64,0xb1);
            auVar57 = vminps_avx512vl(auVar64,auVar47);
            auVar47 = vshufpd_avx(auVar57,auVar57,5);
            auVar47 = vminps_avx(auVar57,auVar47);
            auVar43 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar47 = vshufps_avx512vl(auVar55,auVar55,0xb1);
            auVar55 = vminps_avx512vl(auVar55,auVar47);
            auVar47 = vshufpd_avx(auVar55,auVar55,5);
            auVar47 = vminps_avx(auVar55,auVar47);
            auVar37 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar37 = vunpcklps_avx(auVar43,auVar37);
            auVar47 = vshufps_avx512vl(auVar58,auVar58,0xb1);
            auVar55 = vminps_avx512vl(auVar58,auVar47);
            auVar47 = vshufpd_avx(auVar55,auVar55,5);
            auVar47 = vminps_avx(auVar55,auVar47);
            auVar43 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar43 = vinsertps_avx(auVar37,auVar43,0x28);
            auVar47 = vshufps_avx(auVar61,auVar61,0xb1);
            auVar61 = vmaxps_avx(auVar61,auVar47);
            auVar47 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar47);
            auVar37 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar61 = vshufps_avx(auVar50,auVar50,0xb1);
            auVar61 = vmaxps_avx(auVar50,auVar61);
            auVar50 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar50);
            auVar29 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar29 = vunpcklps_avx(auVar37,auVar29);
            auVar61 = vshufps_avx(auVar46,auVar46,0xb1);
            auVar61 = vmaxps_avx(auVar46,auVar61);
            auVar50 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar50);
            auVar37 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar37 = vinsertps_avx(auVar29,auVar37,0x28);
            auVar50 = vbroadcastss_avx512vl(auVar40);
            auVar47 = vpermps_avx512vl(auVar114,ZEXT1632(auVar40));
            auVar55 = vpermps_avx512vl(auVar45,ZEXT1632(auVar40));
            uVar84 = auVar35._0_4_;
            auVar64._4_4_ = uVar84;
            auVar64._0_4_ = uVar84;
            auVar64._8_4_ = uVar84;
            auVar64._12_4_ = uVar84;
            auVar64._16_4_ = uVar84;
            auVar64._20_4_ = uVar84;
            auVar64._24_4_ = uVar84;
            auVar64._28_4_ = uVar84;
            auVar61 = vpermps_avx2(auVar114,ZEXT1632(auVar35));
            auVar57 = vpermps_avx512vl(auVar45,ZEXT1632(auVar35));
            auVar46 = vbroadcastss_avx512vl(auVar38);
            auVar58 = vpermps_avx512vl(auVar114,ZEXT1632(auVar38));
            auVar59 = vpermps_avx512vl(auVar45,ZEXT1632(auVar38));
            auVar60 = vbroadcastss_avx512vl(auVar116);
            auVar62 = vpermps_avx512vl(auVar114,ZEXT1632(auVar116));
            auVar45 = vpermps_avx512vl(auVar45,ZEXT1632(auVar116));
            auVar63 = vmulps_avx512vl(auVar60,auVar66);
            auVar29 = vfmadd231ps_fma(auVar63,auVar67,auVar46);
            auVar60 = vmulps_avx512vl(auVar60,auVar56);
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar68,auVar46);
            auVar46 = vmulps_avx512vl(auVar62,auVar66);
            auVar46 = vfmadd231ps_avx512vl(auVar46,auVar67,auVar58);
            auVar56 = vmulps_avx512vl(auVar62,auVar56);
            auVar56 = vfmadd231ps_avx512vl(auVar56,auVar68,auVar58);
            auVar66 = vmulps_avx512vl(auVar45,auVar66);
            auVar67 = vfmadd231ps_avx512vl(auVar66,auVar67,auVar59);
            auVar66 = vfmadd231ps_avx512vl(ZEXT1632(auVar29),auVar53,auVar64);
            auVar46 = vfmadd231ps_avx512vl(auVar46,auVar53,auVar61);
            auVar67 = vfmadd231ps_avx512vl(auVar67,auVar53,auVar57);
            auVar53 = vfmadd231ps_avx512vl(auVar66,auVar51,auVar50);
            auVar66 = vfmadd231ps_avx512vl(auVar46,auVar51,auVar47);
            auVar67 = vfmadd231ps_avx512vl(auVar67,auVar51,auVar55);
            auVar46._4_4_ = auVar45._4_4_ * SUB84(bezier_basis0._8568_8_,4);
            auVar46._0_4_ = auVar45._0_4_ * (float)bezier_basis0._8568_8_;
            auVar46._8_4_ = auVar45._8_4_ * (float)bezier_basis0._8576_8_;
            auVar46._12_4_ = auVar45._12_4_ * SUB84(bezier_basis0._8576_8_,4);
            auVar46._16_4_ = auVar45._16_4_ * (float)bezier_basis0._8584_8_;
            auVar46._20_4_ = auVar45._20_4_ * SUB84(bezier_basis0._8584_8_,4);
            auVar46._24_4_ = auVar45._24_4_ * (float)bezier_basis0._8592_8_;
            auVar46._28_4_ = auVar45._28_4_;
            auVar46 = vfmadd231ps_avx512vl(auVar46,auVar68,auVar59);
            auVar51 = vfmadd231ps_avx512vl(auVar60,auVar52,auVar64);
            auVar61 = vfmadd231ps_avx512vl(auVar56,auVar52,auVar61);
            auVar29 = vfmadd231ps_fma(auVar46,auVar52,auVar57);
            auVar50 = vfmadd231ps_avx512vl(auVar51,auVar48,auVar50);
            auVar61 = vfmadd231ps_avx512vl(auVar61,auVar48,auVar47);
            auVar29 = vfmadd231ps_fma(ZEXT1632(auVar29),auVar48,auVar55);
            auVar48 = vmulps_avx512vl(auVar50,auVar49);
            auVar52 = vmulps_avx512vl(auVar61,auVar49);
            auVar56 = vmulps_avx512vl(ZEXT1632(auVar29),auVar49);
            auVar45 = ZEXT1632(auVar39);
            auVar61 = vblendps_avx(auVar48,auVar45,1);
            auVar50 = vblendps_avx(auVar52,auVar45,1);
            auVar46 = vblendps_avx(auVar56,auVar45,1);
            auVar47 = vsubps_avx(auVar53,auVar61);
            auVar51 = vsubps_avx(auVar66,auVar50);
            auVar68 = vsubps_avx512vl(auVar67,auVar46);
            auVar61 = vblendps_avx(auVar48,auVar45,0x80);
            auVar50 = vblendps_avx(auVar52,auVar45,0x80);
            auVar46 = vblendps_avx(auVar56,auVar45,0x80);
            auVar55._0_4_ = auVar53._0_4_ + auVar61._0_4_;
            auVar55._4_4_ = auVar53._4_4_ + auVar61._4_4_;
            auVar55._8_4_ = auVar53._8_4_ + auVar61._8_4_;
            auVar55._12_4_ = auVar53._12_4_ + auVar61._12_4_;
            auVar55._16_4_ = auVar53._16_4_ + auVar61._16_4_;
            auVar55._20_4_ = auVar53._20_4_ + auVar61._20_4_;
            auVar55._24_4_ = auVar53._24_4_ + auVar61._24_4_;
            auVar55._28_4_ = auVar53._28_4_ + auVar61._28_4_;
            auVar57._0_4_ = auVar66._0_4_ + auVar50._0_4_;
            auVar57._4_4_ = auVar66._4_4_ + auVar50._4_4_;
            auVar57._8_4_ = auVar66._8_4_ + auVar50._8_4_;
            auVar57._12_4_ = auVar66._12_4_ + auVar50._12_4_;
            auVar57._16_4_ = auVar66._16_4_ + auVar50._16_4_;
            auVar57._20_4_ = auVar66._20_4_ + auVar50._20_4_;
            auVar57._24_4_ = auVar66._24_4_ + auVar50._24_4_;
            auVar57._28_4_ = auVar66._28_4_ + auVar50._28_4_;
            auVar46 = vaddps_avx512vl(auVar67,auVar46);
            auVar61 = vminps_avx512vl(auVar54,auVar53);
            auVar50 = vminps_avx512vl(auVar54,auVar66);
            auVar48 = vminps_avx512vl(auVar54,auVar67);
            auVar52 = vminps_avx512vl(auVar47,auVar55);
            auVar52 = vminps_avx512vl(auVar61,auVar52);
            auVar61 = vminps_avx512vl(auVar51,auVar57);
            auVar56 = vminps_avx512vl(auVar50,auVar61);
            auVar61 = vminps_avx512vl(auVar68,auVar46);
            auVar48 = vminps_avx512vl(auVar48,auVar61);
            auVar61 = vmaxps_avx(auVar47,auVar55);
            auVar50 = vmaxps_avx512vl(auVar65,auVar53);
            auVar61 = vmaxps_avx(auVar50,auVar61);
            auVar50 = vmaxps_avx(auVar51,auVar57);
            auVar47 = vmaxps_avx512vl(auVar65,auVar66);
            auVar50 = vmaxps_avx(auVar47,auVar50);
            auVar46 = vmaxps_avx(auVar68,auVar46);
            auVar47 = vmaxps_avx512vl(auVar65,auVar67);
            auVar46 = vmaxps_avx(auVar47,auVar46);
            auVar47 = vshufps_avx(auVar52,auVar52,0xb1);
            auVar47 = vminps_avx(auVar52,auVar47);
            auVar51 = vshufpd_avx(auVar47,auVar47,5);
            auVar47 = vminps_avx(auVar47,auVar51);
            auVar29 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar47 = vshufps_avx512vl(auVar56,auVar56,0xb1);
            auVar51 = vminps_avx512vl(auVar56,auVar47);
            auVar47 = vshufpd_avx(auVar51,auVar51,5);
            auVar47 = vminps_avx(auVar51,auVar47);
            auVar35 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar35 = vunpcklps_avx(auVar29,auVar35);
            auVar47 = vshufps_avx512vl(auVar48,auVar48,0xb1);
            auVar51 = vminps_avx512vl(auVar48,auVar47);
            auVar47 = vshufpd_avx(auVar51,auVar51,5);
            auVar47 = vminps_avx(auVar51,auVar47);
            auVar29 = vminps_avx(auVar47._0_16_,auVar47._16_16_);
            auVar29 = vinsertps_avx(auVar35,auVar29,0x28);
            auVar35 = vminps_avx(auVar43,auVar29);
            auVar47 = vshufps_avx(auVar61,auVar61,0xb1);
            auVar61 = vmaxps_avx(auVar61,auVar47);
            auVar47 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar47);
            auVar43 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar61 = vshufps_avx(auVar50,auVar50,0xb1);
            auVar61 = vmaxps_avx(auVar50,auVar61);
            auVar50 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar50);
            auVar29 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar29 = vunpcklps_avx(auVar43,auVar29);
            auVar61 = vshufps_avx(auVar46,auVar46,0xb1);
            auVar61 = vmaxps_avx(auVar46,auVar61);
            auVar50 = vshufpd_avx(auVar61,auVar61,5);
            auVar61 = vmaxps_avx(auVar61,auVar50);
            auVar43 = vmaxps_avx(auVar61._0_16_,auVar61._16_16_);
            auVar43 = vinsertps_avx(auVar29,auVar43,0x28);
            auVar43 = vmaxps_avx(auVar37,auVar43);
            uVar14 = vcmpps_avx512vl(auVar43,auVar44._0_16_,1);
            auVar61._16_16_ = auVar51._16_16_;
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
            uVar15 = vcmpps_avx512vl(auVar35,auVar43,6);
            if ((~((ushort)uVar14 & (ushort)uVar15) & 7) != 0) {
              auVar99 = ZEXT1664(auVar97);
              auVar103 = ZEXT864(0) << 0x20;
              auVar108 = ZEXT1664(auVar104);
              auVar111 = ZEXT1664(auVar109);
              auVar115 = ZEXT1664(auVar112);
              auVar61._0_16_ = (range<unsigned_long>)vxorps_avx512vl(auVar31,auVar31);
              auVar121 = ZEXT1664((undefined1  [16])auVar61._0_16_);
              goto LAB_01ee550b;
            }
            uVar19 = uVar19 + 1;
            lVar22 = lVar22 + 0x38;
            auVar61._0_16_ = (range<unsigned_long>)vxorps_avx512vl(auVar31,auVar31);
            auVar121 = ZEXT1664((undefined1  [16])auVar61._0_16_);
          } while (uVar19 <= (ulong)(long)(int)auVar42._0_4_);
          auVar37._8_8_ = 0;
          auVar37._0_4_ =
               (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               super_Geometry.time_range.lower;
          auVar37._4_4_ =
               (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               super_Geometry.time_range.upper;
          auVar29 = ZEXT816(0) << 0x20;
        }
        local_188.primID = &local_1d0;
        fVar80 = auVar37._0_4_;
        auVar43 = vmovshdup_avx(auVar37);
        local_1c8 = auVar43._0_4_ - fVar80;
        local_178 = (t0t1->lower - fVar80) / local_1c8;
        local_1c8 = (t0t1->upper - fVar80) / local_1c8;
        fVar80 = fVar69 * local_178;
        fVar71 = fVar69 * local_1c8;
        auVar37 = vroundss_avx(ZEXT416((uint)fVar80),ZEXT416((uint)fVar80),9);
        auVar42 = vroundss_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),10);
        auVar43 = vmaxss_avx(auVar37,auVar29);
        local_1a8 = auVar43._0_4_;
        auVar43 = vminss_avx(auVar42,ZEXT416((uint)fVar69));
        iVar23 = (int)local_1a8;
        fVar81 = auVar43._0_4_;
        uVar18 = (int)auVar37._0_4_;
        if ((int)auVar37._0_4_ < 0) {
          uVar18 = 0xffffffff;
        }
        iVar26 = (int)fVar69 + 1;
        if ((int)auVar42._0_4_ < (int)fVar69 + 1) {
          iVar26 = (int)auVar42._0_4_;
        }
        local_1d0 = uVar20;
        local_188.this = this;
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_138.field_1,&local_188,(long)iVar23);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_158.field_1,&local_188,(long)(int)fVar81);
        fVar80 = fVar80 - local_1a8;
        if (iVar26 - uVar18 == 1) {
          auVar43 = ZEXT816(0) << 0x40;
          auVar37 = vmaxss_avx(ZEXT416((uint)fVar80),auVar43);
          fVar69 = auVar37._0_4_;
          fVar80 = 1.0 - fVar69;
          auVar100._0_4_ = fVar69 * local_158.m128[0];
          auVar100._4_4_ = fVar69 * local_158.m128[1];
          auVar100._8_4_ = fVar69 * local_158.m128[2];
          auVar100._12_4_ = fVar69 * local_158.m128[3];
          auVar75._4_4_ = fVar80;
          auVar75._0_4_ = fVar80;
          auVar75._8_4_ = fVar80;
          auVar75._12_4_ = fVar80;
          auVar42 = vfmadd231ps_fma(auVar100,auVar75,(undefined1  [16])local_138);
          auVar105._0_4_ = fVar69 * local_148._0_4_;
          auVar105._4_4_ = fVar69 * local_148._4_4_;
          auVar105._8_4_ = fVar69 * local_148._8_4_;
          auVar105._12_4_ = fVar69 * local_148._12_4_;
          auVar35 = vfmadd231ps_fma(auVar105,local_128,auVar75);
          auVar37 = vmaxss_avx(ZEXT416((uint)(fVar81 - fVar71)),auVar43);
          fVar71 = auVar37._0_4_;
          fVar80 = 1.0 - fVar71;
          auVar86._0_4_ = fVar71 * local_138.m128[0];
          auVar86._4_4_ = fVar71 * local_138.m128[1];
          auVar86._8_4_ = fVar71 * local_138.m128[2];
          auVar86._12_4_ = fVar71 * local_138.m128[3];
          auVar76._4_4_ = fVar80;
          auVar76._0_4_ = fVar80;
          auVar76._8_4_ = fVar80;
          auVar76._12_4_ = fVar80;
          auVar90 = vfmadd231ps_fma(auVar86,auVar76,(undefined1  [16])local_158);
          auVar91._0_4_ = fVar71 * local_128._0_4_;
          auVar91._4_4_ = fVar71 * local_128._4_4_;
          auVar91._8_4_ = fVar71 * local_128._8_4_;
          auVar91._12_4_ = fVar71 * local_128._12_4_;
          auVar94 = vfmadd231ps_fma(auVar91,auVar76,local_148);
          auVar37 = auVar61._16_16_;
          auVar29 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
          auVar121 = ZEXT1664(auVar29);
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_98.field_1,&local_188,(long)(iVar23 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_b8.field_1,&local_188,(long)((int)fVar81 + -1));
          auVar43 = vmaxss_avx(ZEXT416((uint)fVar80),ZEXT816(0) << 0x40);
          fVar70 = auVar43._0_4_;
          auVar101._0_4_ = fVar70 * local_98.m128[0];
          auVar101._4_4_ = fVar70 * local_98.m128[1];
          auVar101._8_4_ = fVar70 * local_98.m128[2];
          auVar101._12_4_ = fVar70 * local_98.m128[3];
          fVar80 = 1.0 - fVar70;
          auVar72._4_4_ = fVar80;
          auVar72._0_4_ = fVar80;
          auVar72._8_4_ = fVar80;
          auVar72._12_4_ = fVar80;
          auVar42 = vfmadd231ps_fma(auVar101,auVar72,(undefined1  [16])local_138);
          auVar106._0_4_ = fVar70 * local_88;
          auVar106._4_4_ = fVar70 * fStack_84;
          auVar106._8_4_ = fVar70 * fStack_80;
          auVar106._12_4_ = fVar70 * fStack_7c;
          auVar35 = vfmadd231ps_fma(auVar106,auVar72,local_128);
          auVar43 = vmaxss_avx(ZEXT416((uint)(fVar81 - fVar71)),ZEXT816(0) << 0x40);
          fVar71 = auVar43._0_4_;
          fVar80 = 1.0 - fVar71;
          auVar89._0_4_ = fVar71 * local_b8.m128[0];
          auVar89._4_4_ = fVar71 * local_b8.m128[1];
          auVar89._8_4_ = fVar71 * local_b8.m128[2];
          auVar89._12_4_ = fVar71 * local_b8.m128[3];
          auVar78._4_4_ = fVar80;
          auVar78._0_4_ = fVar80;
          auVar78._8_4_ = fVar80;
          auVar78._12_4_ = fVar80;
          auVar90 = vfmadd231ps_fma(auVar89,auVar78,(undefined1  [16])local_158);
          auVar93._0_4_ = fVar71 * local_a8;
          auVar93._4_4_ = fVar71 * fStack_a4;
          auVar93._8_4_ = fVar71 * fStack_a0;
          auVar93._12_4_ = fVar71 * fStack_9c;
          auVar94 = vfmadd231ps_fma(auVar93,auVar78,local_148);
          if ((int)(uVar18 + 1) < iVar26) {
            local_118 = local_1c8 - local_178;
            itime = (size_t)(uVar18 + 1);
            iVar26 = ~uVar18 + iVar26;
            do {
              auVar29 = auVar121._0_16_;
              auVar37 = auVar61._16_16_;
              local_1a8 = auVar94._0_4_;
              fStack_1a4 = auVar94._4_4_;
              fStack_1a0 = auVar94._8_4_;
              fStack_19c = auVar94._12_4_;
              local_208 = auVar90._0_4_;
              fStack_204 = auVar90._4_4_;
              fStack_200 = auVar90._8_4_;
              fStack_1fc = auVar90._12_4_;
              fVar71 = ((float)(int)itime / fVar69 - local_178) / local_118;
              fVar80 = 1.0 - fVar71;
              auVar83._0_4_ = local_208 * fVar71;
              auVar83._4_4_ = fStack_204 * fVar71;
              auVar83._8_4_ = fStack_200 * fVar71;
              auVar83._12_4_ = fStack_1fc * fVar71;
              auVar79._4_4_ = fVar80;
              auVar79._0_4_ = fVar80;
              auVar79._8_4_ = fVar80;
              auVar79._12_4_ = fVar80;
              auVar43 = vfmadd231ps_fma(auVar83,auVar79,auVar42);
              local_1c8 = auVar43._0_4_;
              uStack_1c4 = auVar43._4_4_;
              uStack_1c0 = auVar43._8_8_;
              auVar73._0_4_ = local_1a8 * fVar71;
              auVar73._4_4_ = fStack_1a4 * fVar71;
              auVar73._8_4_ = fStack_1a0 * fVar71;
              auVar73._12_4_ = fStack_19c * fVar71;
              auVar43 = vfmadd231ps_fma(auVar73,auVar35,auVar79);
              local_f8 = auVar43._0_8_;
              uStack_f0 = auVar43._8_8_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_d8.field_1,&local_188,itime);
              local_298 = auVar35._0_4_;
              fStack_294 = auVar35._4_4_;
              fStack_290 = auVar35._8_4_;
              fStack_28c = auVar35._12_4_;
              local_288 = auVar42._0_4_;
              fStack_284 = auVar42._4_4_;
              fStack_280 = auVar42._8_4_;
              fStack_27c = auVar42._12_4_;
              auVar42 = vxorps_avx512vl(auVar29,auVar29);
              auVar121 = ZEXT1664(auVar42);
              auVar16._4_4_ = uStack_1c4;
              auVar16._0_4_ = local_1c8;
              auVar16._8_8_ = uStack_1c0;
              auVar43 = vsubps_avx((undefined1  [16])local_d8,auVar16);
              auVar17._8_8_ = uStack_f0;
              auVar17._0_8_ = local_f8;
              auVar29 = vsubps_avx(local_c8,auVar17);
              auVar43 = vminps_avx512vl(auVar43,auVar42);
              auVar61._0_16_ = (range<unsigned_long>)vmaxps_avx512vl(auVar29,auVar42);
              auVar61._16_16_ = auVar37;
              auVar42._0_4_ = local_288 + auVar43._0_4_;
              auVar42._4_4_ = fStack_284 + auVar43._4_4_;
              auVar42._8_4_ = fStack_280 + auVar43._8_4_;
              auVar42._12_4_ = fStack_27c + auVar43._12_4_;
              auVar90._0_4_ = local_208 + auVar43._0_4_;
              auVar90._4_4_ = fStack_204 + auVar43._4_4_;
              auVar90._8_4_ = fStack_200 + auVar43._8_4_;
              auVar90._12_4_ = fStack_1fc + auVar43._12_4_;
              auVar35._0_4_ = local_298 + auVar61._0_4_;
              auVar35._4_4_ = fStack_294 + auVar61._4_4_;
              auVar35._8_4_ = fStack_290 + auVar61._8_4_;
              auVar35._12_4_ = fStack_28c + auVar61._12_4_;
              auVar94._0_4_ = local_1a8 + auVar61._0_4_;
              auVar94._4_4_ = fStack_1a4 + auVar61._4_4_;
              auVar94._8_4_ = fStack_1a0 + auVar61._8_4_;
              auVar94._12_4_ = fStack_19c + auVar61._12_4_;
              itime = itime + 1;
              iVar26 = iVar26 + -1;
            } while (iVar26 != 0);
          }
          else {
            auVar37 = auVar61._16_16_;
            auVar43 = vxorps_avx512vl(auVar121._0_16_,auVar121._0_16_);
            auVar121 = ZEXT1664(auVar43);
          }
          auVar43 = ZEXT816(0) << 0x40;
        }
        auVar103 = ZEXT1664(auVar43);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar42,ZEXT416(geomID),0x30);
        uVar18 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 super_Geometry.numTimeSteps - 1;
        uVar19 = (ulong)uVar18;
        BVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        auVar74._8_8_ = 0;
        auVar74._0_4_ = BVar1.lower;
        auVar74._4_4_ = BVar1.upper;
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx(auVar35,ZEXT416((uint)uVar20),0x30);
        aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar90,ZEXT416(uVar18),0x30);
        aVar13 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar94,ZEXT416(uVar18),0x30);
        auVar102._8_4_ = 0x3f000000;
        auVar102._0_8_ = 0x3f0000003f000000;
        auVar102._12_4_ = 0x3f000000;
        auVar95._0_4_ = aVar12.x * 0.5;
        auVar95._4_4_ = aVar12.y * 0.5;
        auVar95._8_4_ = aVar12.z * 0.5;
        auVar95._12_4_ = aVar12.field_3.w * 0.5;
        auVar43 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar10,auVar102);
        auVar98._0_4_ = aVar13.x * 0.5;
        auVar98._4_4_ = aVar13.y * 0.5;
        auVar98._8_4_ = aVar13.z * 0.5;
        auVar98._12_4_ = aVar13.field_3.w * 0.5;
        auVar29 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar11,auVar102);
        auVar96._0_4_ = auVar43._0_4_ + auVar29._0_4_;
        auVar96._4_4_ = auVar43._4_4_ + auVar29._4_4_;
        auVar96._8_4_ = auVar43._8_4_ + auVar29._8_4_;
        auVar96._12_4_ = auVar43._12_4_ + auVar29._12_4_;
        auVar43 = vminps_avx(auVar109,(undefined1  [16])aVar10);
        auVar111 = ZEXT1664(auVar43);
        auVar43 = vmaxps_avx(auVar104,(undefined1  [16])aVar11);
        auVar108 = ZEXT1664(auVar43);
        local_258.m128 = (__m128)vminps_avx(local_258.m128,(undefined1  [16])aVar12);
        local_248.m128 = (__m128)vmaxps_avx(local_248.m128,(undefined1  [16])aVar13);
        auVar43 = vminps_avx(auVar112,auVar96);
        auVar115 = ZEXT1664(auVar43);
        local_228.m128 = (__m128)vmaxps_avx(local_228.m128,auVar96);
        uVar21 = vcmpps_avx512vl(auVar97,auVar74,1);
        auVar29 = vinsertps_avx(auVar97,auVar74,0x50);
        auVar43 = vblendps_avx(auVar74,auVar97,2);
        bVar28 = (bool)((byte)uVar21 & 1);
        bVar7 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar21 >> 3) & 1);
        auVar99 = ZEXT1664(CONCAT412((uint)bVar9 * auVar29._12_4_ | (uint)!bVar9 * auVar43._12_4_,
                                     CONCAT48((uint)bVar8 * auVar29._8_4_ |
                                              (uint)!bVar8 * auVar43._8_4_,
                                              CONCAT44((uint)bVar7 * auVar29._4_4_ |
                                                       (uint)!bVar7 * auVar43._4_4_,
                                                       (uint)bVar28 * auVar29._0_4_ |
                                                       (uint)!bVar28 * auVar43._0_4_))));
        local_270 = local_270 + 1;
        local_268 = local_268 + uVar19;
        bVar28 = local_2a8 < uVar19;
        auVar43 = vmovshdup_avx(auVar74);
        auVar59._16_16_ = auVar37;
        auVar59._0_16_ = local_238;
        auVar58._4_28_ = auVar59._4_28_;
        auVar58._0_4_ = (uint)bVar28 * auVar43._0_4_ + (uint)!bVar28 * local_238._0_4_;
        local_238 = auVar58._0_16_;
        auVar60._16_16_ = auVar37;
        auVar60._0_16_ = local_218;
        auVar61._4_28_ = auVar60._4_28_;
        auVar61._0_4_ = (uint)bVar28 * (int)BVar1.lower + (uint)!bVar28 * local_218._0_4_;
        local_218 = auVar61._0_16_;
        if (local_2a8 <= uVar19) {
          local_2a8 = uVar19;
        }
        pPVar6 = prims->items;
        pPVar6[local_260].lbounds.bounds0.lower.field_0 = aVar10;
        pPVar6[local_260].lbounds.bounds0.upper.field_0 = aVar11;
        pPVar6[local_260].lbounds.bounds1.lower.field_0.field_1 = aVar12;
        pPVar6[local_260].lbounds.bounds1.upper.field_0.field_1 = aVar13;
        pPVar6[local_260].time_range = BVar1;
        local_260 = local_260 + 1;
      }
LAB_01ee550b:
      auVar43 = auVar99._0_16_;
      uVar20 = uVar20 + 1;
    } while (uVar20 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_270;
    aVar110 = auVar111._0_16_;
    aVar107 = auVar108._0_16_;
    aVar113 = auVar115._0_16_;
  }
  else {
    auVar43 = SUB6416(ZEXT464(0x3f800000),0);
    local_258.m128[2] = INFINITY;
    local_258._0_8_ = 0x7f8000007f800000;
    local_258.m128[3] = INFINITY;
    local_228.m128[2] = -INFINITY;
    local_228._0_8_ = 0xff800000ff800000;
    local_228.m128[3] = -INFINITY;
    local_218._0_4_ = 0.0;
    local_238._0_4_ = 1.0;
    local_2a8 = 0;
    local_268 = 0;
    local_248 = local_228;
    aVar110 = local_258;
    aVar107 = local_228;
    aVar113 = local_258;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar110;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar107;
  *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
   (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower
   .field_0.m128 = local_258;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_248;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar113;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_228;
  BVar1 = (BBox1f)vmovlps_avx(auVar43);
  __return_storage_ptr__->time_range = BVar1;
  __return_storage_ptr__->num_time_segments = local_268;
  __return_storage_ptr__->max_num_time_segments = local_2a8;
  (__return_storage_ptr__->max_time_range).lower = (float)local_218._0_4_;
  (__return_storage_ptr__->max_time_range).upper = (float)local_238._0_4_;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }